

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::isTimeLimitReached
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool forceCheck)

{
  type_conflict5 tVar1;
  byte in_SIL;
  time_t *__timer;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  double extraout_XMM0_Qa;
  Real RVar2;
  Real avgtimeinterval;
  int nClckSkips;
  Real currtime;
  double *in_stack_ffffffffffffff58;
  type *in_stack_ffffffffffffff60;
  double dVar3;
  cpp_dec_float<50U,_int,_void> *this_00;
  int local_7c;
  time_t local_6c [7];
  byte local_31;
  undefined8 local_20;
  undefined8 local_18;
  time_t *local_10;
  undefined8 local_8;
  
  local_31 = in_SIL & 1;
  in_RDI->nCallsToTimelim = in_RDI->nCallsToTimelim + 1;
  this_00 = (cpp_dec_float<50U,_int,_void> *)&in_RDI->maxTime;
  local_18 = infinity();
  local_10 = local_6c;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)in_RDI,in_stack_ffffffffffffff60);
  __timer = local_6c;
  tVar1 = boost::multiprecision::operator>=
                    (in_stack_ffffffffffffff58,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x37006e);
  if (!tVar1) {
    if ((((local_31 & 1) == 0) && (199 < in_RDI->nCallsToTimelim)) && (0 < in_RDI->nClckSkipsLeft))
    {
      in_RDI->nClckSkipsLeft = in_RDI->nClckSkipsLeft + -1;
    }
    else {
      time(in_RDI,__timer);
      if (in_RDI->maxTime <= extraout_XMM0_Qa) {
        return true;
      }
      local_7c = 0x20;
      dVar3 = extraout_XMM0_Qa;
      RVar2 = cumulativeTime(in_RDI);
      if (((in_RDI->maxTime - extraout_XMM0_Qa) * 0.01) /
          ((dVar3 + RVar2) / (double)in_RDI->nCallsToTimelim + 1e-06) < 32.0) {
        local_7c = 0;
      }
      in_RDI->nClckSkipsLeft = local_7c;
    }
  }
  return false;
}

Assistant:

bool SPxSolverBase<R>::isTimeLimitReached(const bool forceCheck)
   {
      // always update the number of calls, since the user might set a time limit later in the solving process
      ++nCallsToTimelim;

      // check if a time limit is actually set
      if(maxTime >= R(infinity))
         return false;

      // check if the expensive system call to update the time should be skipped again
      if(forceCheck || nCallsToTimelim < SOPLEX_NINITCALLS ||  nClckSkipsLeft <= 0)
      {
         Real currtime = time();

         if(currtime >= maxTime)
            return true;

         // determine the number of times the clock can be skipped again.
         int nClckSkips = SOPLEX_MAXNCLCKSKIPS;
         Real avgtimeinterval = (currtime + cumulativeTime()) / (Real)(nCallsToTimelim);

         // it would not be safe to skip the clock so many times since we are approaching the time limit
         if(SOPLEX_SAFETYFACTOR * (maxTime - currtime) / (avgtimeinterval + 1e-6) < nClckSkips)
            nClckSkips = 0;

         nClckSkipsLeft = nClckSkips;
      }
      else
         --nClckSkipsLeft;

      return false;
   }